

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O3

REF_STATUS ref_geom_verify_param(REF_GRID ref_grid)

{
  REF_GEOM ref_geom;
  REF_NODE pRVar1;
  REF_DBL *pRVar2;
  REF_GRID pRVar3;
  int iVar4;
  uint uVar5;
  undefined8 uVar6;
  REF_MPI pRVar7;
  char *pcVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  double dVar12;
  REF_DBL max;
  REF_DBL global_max;
  REF_DBL max_node;
  REF_BOOL node_constraint;
  REF_DBL xyz [3];
  REF_DBL max_edge;
  REF_BOOL edge_constraint;
  double local_a0;
  double local_98;
  REF_MPI local_90;
  double local_88;
  int local_7c;
  double local_78;
  double local_70;
  double local_68;
  double dStack_60;
  double local_58;
  REF_GRID local_48;
  double local_40;
  int local_34;
  
  ref_geom = ref_grid->geom;
  if (ref_geom->model == (void *)0x0) {
    uVar5 = 0;
  }
  else {
    pRVar7 = ref_grid->mpi;
    pRVar1 = ref_grid->node;
    local_a0 = 0.0;
    iVar4 = ref_geom->max;
    local_90 = pRVar7;
    local_48 = ref_grid;
    if (0 < iVar4) {
      lVar11 = 0;
      lVar10 = 0;
      do {
        if ((*(int *)((long)ref_geom->descr + lVar11) == 0) &&
           (lVar9 = (long)*(int *)((long)ref_geom->descr + lVar11 + 0x14),
           pRVar7->id == pRVar1->part[lVar9])) {
          uVar5 = ref_egads_eval(ref_geom,(REF_INT)lVar10,&local_68,(REF_DBL *)0x0);
          if (uVar5 != 0) {
            pcVar8 = "eval xyz";
            uVar6 = 0x761;
            goto LAB_00156eb5;
          }
          pRVar2 = pRVar1->real;
          dVar12 = SQRT((local_58 - pRVar2[lVar9 * 0xf + 2]) * (local_58 - pRVar2[lVar9 * 0xf + 2])
                        + (dStack_60 - pRVar2[lVar9 * 0xf + 1]) *
                          (dStack_60 - pRVar2[lVar9 * 0xf + 1]) +
                          (local_68 - pRVar2[lVar9 * 0xf]) * (local_68 - pRVar2[lVar9 * 0xf]));
          if (local_a0 <= dVar12) {
            local_a0 = dVar12;
          }
          iVar4 = ref_geom->max;
          pRVar7 = local_90;
        }
        lVar10 = lVar10 + 1;
        lVar11 = lVar11 + 0x18;
      } while (lVar10 < iVar4);
    }
    uVar5 = ref_mpi_max(pRVar7,&local_a0,&local_98,3);
    if (uVar5 == 0) {
      local_a0 = local_98;
      if (local_48->mpi->id == 0) {
        printf("CAD topo node max eval dist %e\n");
      }
      local_a0 = 0.0;
      local_88 = 0.0;
      pRVar7 = local_90;
      if (0 < ref_geom->max) {
        local_78 = 0.0;
        lVar11 = 0;
        lVar10 = 0;
        do {
          if (*(int *)((long)ref_geom->descr + lVar11) == 1) {
            iVar4 = *(int *)((long)ref_geom->descr + lVar11 + 0x14);
            lVar9 = (long)iVar4;
            if (pRVar7->id == pRVar1->part[lVar9]) {
              uVar5 = ref_egads_eval(ref_geom,(REF_INT)lVar10,&local_68,(REF_DBL *)0x0);
              if (uVar5 != 0) {
                pcVar8 = "eval xyz";
                uVar6 = 0x770;
                goto LAB_00156eb5;
              }
              pRVar2 = pRVar1->real;
              local_70 = SQRT((local_58 - pRVar2[lVar9 * 0xf + 2]) *
                              (local_58 - pRVar2[lVar9 * 0xf + 2]) +
                              (dStack_60 - pRVar2[lVar9 * 0xf + 1]) *
                              (dStack_60 - pRVar2[lVar9 * 0xf + 1]) +
                              (local_68 - pRVar2[lVar9 * 0xf]) * (local_68 - pRVar2[lVar9 * 0xf]));
              ref_geom_is_a(ref_geom,iVar4,0,&local_7c);
              pRVar7 = local_90;
              if (local_7c == 0) {
                if (local_a0 <= local_70) {
                  local_a0 = local_70;
                }
              }
              else {
                local_88 = local_78;
                if (local_78 <= local_70) {
                  local_88 = local_70;
                  local_78 = local_70;
                }
              }
            }
          }
          lVar10 = lVar10 + 1;
          lVar11 = lVar11 + 0x18;
        } while (lVar10 < ref_geom->max);
      }
      uVar5 = ref_mpi_max(pRVar7,&local_a0,&local_98,3);
      pRVar3 = local_48;
      if (uVar5 == 0) {
        local_a0 = local_98;
        if (local_48->mpi->id == 0) {
          printf("CAD topo edge max eval dist %e\n");
        }
        uVar5 = ref_mpi_max(local_90,&local_88,&local_98,3);
        if (uVar5 == 0) {
          local_88 = local_98;
          if (pRVar3->mpi->id == 0) {
            printf("CAD topo edge node tol %e\n");
          }
          local_a0 = 0.0;
          local_88 = 0.0;
          local_40 = 0.0;
          pRVar7 = local_90;
          if (0 < ref_geom->max) {
            local_78 = 0.0;
            lVar10 = 0;
            lVar11 = 0;
            do {
              if (*(int *)((long)ref_geom->descr + lVar10) == 2) {
                iVar4 = *(int *)((long)ref_geom->descr + lVar10 + 0x14);
                lVar9 = (long)iVar4;
                if (pRVar7->id == pRVar1->part[lVar9]) {
                  uVar5 = ref_egads_eval(ref_geom,(REF_INT)lVar11,&local_68,(REF_DBL *)0x0);
                  if (uVar5 != 0) {
                    pcVar8 = "eval xyz";
                    uVar6 = 0x789;
                    goto LAB_00156eb5;
                  }
                  pRVar2 = pRVar1->real;
                  local_70 = SQRT((local_58 - pRVar2[lVar9 * 0xf + 2]) *
                                  (local_58 - pRVar2[lVar9 * 0xf + 2]) +
                                  (dStack_60 - pRVar2[lVar9 * 0xf + 1]) *
                                  (dStack_60 - pRVar2[lVar9 * 0xf + 1]) +
                                  (local_68 - pRVar2[lVar9 * 0xf]) *
                                  (local_68 - pRVar2[lVar9 * 0xf]));
                  ref_geom_is_a(ref_geom,iVar4,0,&local_7c);
                  ref_geom_is_a(ref_geom,iVar4,1,&local_34);
                  pRVar7 = local_90;
                  if (local_7c == 0) {
                    if (local_34 == 0) {
                      if (local_a0 <= local_70) {
                        local_a0 = local_70;
                      }
                    }
                    else {
                      local_40 = local_78;
                      if (local_78 <= local_70) {
                        local_78 = local_70;
                        local_40 = local_70;
                      }
                    }
                  }
                  else if (local_88 <= local_70) {
                    local_88 = local_70;
                  }
                }
              }
              lVar11 = lVar11 + 1;
              lVar10 = lVar10 + 0x18;
            } while (lVar11 < ref_geom->max);
          }
          uVar5 = ref_mpi_max(pRVar7,&local_a0,&local_98,3);
          pRVar3 = local_48;
          if (uVar5 == 0) {
            local_a0 = local_98;
            if (local_48->mpi->id == 0) {
              printf("CAD topo face max eval dist %e\n");
            }
            uVar5 = ref_mpi_max(local_90,&local_40,&local_98,3);
            if (uVar5 == 0) {
              local_40 = local_98;
              if (pRVar3->mpi->id == 0) {
                printf("CAD topo face edge tol %e\n");
              }
              uVar5 = ref_mpi_max(local_90,&local_88,&local_98,3);
              if (uVar5 == 0) {
                local_88 = local_98;
                if (pRVar3->mpi->id != 0) {
                  return 0;
                }
                printf("CAD topo face node tol %e\n");
                return 0;
              }
              pcVar8 = "mpi max edge";
              uVar6 = 0x7a1;
            }
            else {
              pcVar8 = "mpi max edge";
              uVar6 = 0x79d;
            }
          }
          else {
            pcVar8 = "mpi max face";
            uVar6 = 0x799;
          }
        }
        else {
          pcVar8 = "mpi max edge";
          uVar6 = 0x77f;
        }
      }
      else {
        pcVar8 = "mpi max edge";
        uVar6 = 0x77b;
      }
    }
    else {
      pcVar8 = "mpi max node";
      uVar6 = 0x767;
    }
LAB_00156eb5:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",uVar6,
           "ref_geom_verify_param",(ulong)uVar5,pcVar8);
  }
  return uVar5;
}

Assistant:

REF_FCN REF_STATUS ref_geom_verify_param(REF_GRID ref_grid) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_INT geom;
  REF_INT node;
  REF_DBL xyz[3];
  REF_DBL dist, max, max_node, max_edge, global_max;
  REF_BOOL node_constraint, edge_constraint;

  if (!ref_geom_model_loaded(ref_geom)) return REF_SUCCESS;

  max = 0.0;
  each_ref_geom_node(ref_geom, geom) {
    node = ref_geom_node(ref_geom, geom);
    if (ref_mpi_rank(ref_mpi) != ref_node_part(ref_node, node)) continue;
    RSS(ref_egads_eval(ref_geom, geom, xyz, NULL), "eval xyz");
    dist = sqrt(pow(xyz[0] - ref_node_xyz(ref_node, 0, node), 2) +
                pow(xyz[1] - ref_node_xyz(ref_node, 1, node), 2) +
                pow(xyz[2] - ref_node_xyz(ref_node, 2, node), 2));
    max = MAX(max, dist);
  }
  RSS(ref_mpi_max(ref_mpi, &max, &global_max, REF_DBL_TYPE), "mpi max node");
  max = global_max;
  if (ref_grid_once(ref_grid)) printf("CAD topo node max eval dist %e\n", max);

  max = 0.0;
  max_node = 0.0;
  each_ref_geom_edge(ref_geom, geom) {
    node = ref_geom_node(ref_geom, geom);
    if (ref_mpi_rank(ref_mpi) != ref_node_part(ref_node, node)) continue;
    RSS(ref_egads_eval(ref_geom, geom, xyz, NULL), "eval xyz");
    dist = sqrt(pow(xyz[0] - ref_node_xyz(ref_node, 0, node), 2) +
                pow(xyz[1] - ref_node_xyz(ref_node, 1, node), 2) +
                pow(xyz[2] - ref_node_xyz(ref_node, 2, node), 2));
    RSS(ref_geom_is_a(ref_geom, node, REF_GEOM_NODE, &node_constraint), "n");
    if (node_constraint) {
      max_node = MAX(max_node, dist);
    } else {
      max = MAX(max, dist);
    }
  }
  RSS(ref_mpi_max(ref_mpi, &max, &global_max, REF_DBL_TYPE), "mpi max edge");
  max = global_max;
  if (ref_grid_once(ref_grid)) printf("CAD topo edge max eval dist %e\n", max);
  RSS(ref_mpi_max(ref_mpi, &max_node, &global_max, REF_DBL_TYPE),
      "mpi max edge");
  max_node = global_max;
  if (ref_grid_once(ref_grid)) printf("CAD topo edge node tol %e\n", max_node);

  max = 0.0;
  max_node = 0.0;
  max_edge = 0.0;
  each_ref_geom_face(ref_geom, geom) {
    node = ref_geom_node(ref_geom, geom);
    if (ref_mpi_rank(ref_mpi) != ref_node_part(ref_node, node)) continue;
    RSS(ref_egads_eval(ref_geom, geom, xyz, NULL), "eval xyz");
    dist = sqrt(pow(xyz[0] - ref_node_xyz(ref_node, 0, node), 2) +
                pow(xyz[1] - ref_node_xyz(ref_node, 1, node), 2) +
                pow(xyz[2] - ref_node_xyz(ref_node, 2, node), 2));
    RSS(ref_geom_is_a(ref_geom, node, REF_GEOM_NODE, &node_constraint), "n");
    RSS(ref_geom_is_a(ref_geom, node, REF_GEOM_EDGE, &edge_constraint), "n");
    if (node_constraint) {
      max_node = MAX(max_node, dist);
    } else {
      if (edge_constraint) {
        max_edge = MAX(max_edge, dist);
      } else {
        max = MAX(max, dist);
      }
    }
  }
  RSS(ref_mpi_max(ref_mpi, &max, &global_max, REF_DBL_TYPE), "mpi max face");
  max = global_max;
  if (ref_grid_once(ref_grid)) printf("CAD topo face max eval dist %e\n", max);
  RSS(ref_mpi_max(ref_mpi, &max_edge, &global_max, REF_DBL_TYPE),
      "mpi max edge");
  max_edge = global_max;
  if (ref_grid_once(ref_grid)) printf("CAD topo face edge tol %e\n", max_edge);
  RSS(ref_mpi_max(ref_mpi, &max_node, &global_max, REF_DBL_TYPE),
      "mpi max edge");
  max_node = global_max;
  if (ref_grid_once(ref_grid)) printf("CAD topo face node tol %e\n", max_node);

  return REF_SUCCESS;
}